

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<OrderedScreen*>,long_long>
               (reverse_iterator<OrderedScreen_*> first,longlong n,
               reverse_iterator<OrderedScreen_*> d_first)

{
  undefined8 uVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  _drmModeModeInfo *p_Var6;
  Data *pDVar7;
  QKmsPlane *pQVar8;
  qreal qVar9;
  qreal qVar10;
  drmModePropertyPtr p_Var11;
  drmModePropertyBlobPtr p_Var12;
  QSize QVar13;
  OrderedScreen *pOVar14;
  OrderedScreen *pOVar15;
  Representation RVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  undefined4 uVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  undefined7 uVar23;
  undefined3 uVar24;
  undefined3 uVar25;
  bool bVar26;
  undefined3 uVar27;
  uint32_t uVar28;
  bool bVar29;
  uint32_t uVar30;
  OrderedScreen *pOVar31;
  OrderedScreen *pOVar32;
  OrderedScreen *pOVar33;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (OrderedScreen *)(d_first.current)->screen;
  pOVar33 = local_58.end.current + -n;
  pOVar32 = (OrderedScreen *)(first.current)->screen;
  local_58.intermediate.current = local_58.end.current;
  pOVar14 = pOVar33;
  pOVar31 = pOVar32;
  if (pOVar33 < pOVar32) {
    pOVar14 = pOVar32;
    pOVar31 = pOVar33;
  }
  while (pOVar15 = local_58.intermediate.current, local_58.intermediate.current != pOVar14) {
    local_58.intermediate.current[-1].screen = pOVar32[-1].screen;
    RVar16.m_i = pOVar32[-1].vinfo.virtualPos.xp.m_i;
    uVar1 = *(undefined8 *)((long)&pOVar32[-1].vinfo.virtualPos.xp.m_i + 1);
    local_58.intermediate.current[-1].vinfo.virtualIndex = pOVar32[-1].vinfo.virtualIndex;
    local_58.intermediate.current[-1].vinfo.virtualPos.xp = (Representation)RVar16.m_i;
    *(undefined8 *)((long)&local_58.intermediate.current[-1].vinfo.virtualPos.xp.m_i + 1) = uVar1;
    pDVar2 = pOVar32[-1].vinfo.output.name.d.d;
    pOVar32[-1].vinfo.output.name.d.d = (Data *)0x0;
    local_58.intermediate.current[-1].vinfo.output.name.d.d = pDVar2;
    pcVar3 = pOVar32[-1].vinfo.output.name.d.ptr;
    pOVar32[-1].vinfo.output.name.d.ptr = (char16_t *)0x0;
    local_58.intermediate.current[-1].vinfo.output.name.d.ptr = pcVar3;
    qVar4 = pOVar32[-1].vinfo.output.name.d.size;
    pOVar32[-1].vinfo.output.name.d.size = 0;
    local_58.intermediate.current[-1].vinfo.output.name.d.size = qVar4;
    uVar17 = pOVar32[-1].vinfo.output.crtc_index;
    uVar18 = pOVar32[-1].vinfo.output.crtc_id;
    uVar19 = *(undefined4 *)&pOVar32[-1].vinfo.output.field_0x24;
    qVar9 = pOVar32[-1].vinfo.output.physical_size.wd;
    qVar10 = pOVar32[-1].vinfo.output.physical_size.ht;
    iVar20 = pOVar32[-1].vinfo.output.preferred_mode;
    iVar21 = pOVar32[-1].vinfo.output.mode;
    bVar22 = pOVar32[-1].vinfo.output.mode_set;
    uVar23 = *(undefined7 *)&pOVar32[-1].vinfo.output.field_0x41;
    local_58.intermediate.current[-1].vinfo.output.connector_id =
         pOVar32[-1].vinfo.output.connector_id;
    local_58.intermediate.current[-1].vinfo.output.crtc_index = uVar17;
    local_58.intermediate.current[-1].vinfo.output.crtc_id = uVar18;
    *(undefined4 *)&local_58.intermediate.current[-1].vinfo.output.field_0x24 = uVar19;
    local_58.intermediate.current[-1].vinfo.output.physical_size.wd = qVar9;
    local_58.intermediate.current[-1].vinfo.output.physical_size.ht = qVar10;
    local_58.intermediate.current[-1].vinfo.output.preferred_mode = iVar20;
    local_58.intermediate.current[-1].vinfo.output.mode = iVar21;
    local_58.intermediate.current[-1].vinfo.output.mode_set = bVar22;
    *(undefined7 *)&local_58.intermediate.current[-1].vinfo.output.field_0x41 = uVar23;
    local_58.intermediate.current[-1].vinfo.output.saved_crtc = pOVar32[-1].vinfo.output.saved_crtc;
    pDVar5 = pOVar32[-1].vinfo.output.modes.d.d;
    pOVar32[-1].vinfo.output.modes.d.d = (Data *)0x0;
    local_58.intermediate.current[-1].vinfo.output.modes.d.d = pDVar5;
    p_Var6 = pOVar32[-1].vinfo.output.modes.d.ptr;
    pOVar32[-1].vinfo.output.modes.d.ptr = (_drmModeModeInfo *)0x0;
    local_58.intermediate.current[-1].vinfo.output.modes.d.ptr = p_Var6;
    qVar4 = pOVar32[-1].vinfo.output.modes.d.size;
    pOVar32[-1].vinfo.output.modes.d.size = 0;
    local_58.intermediate.current[-1].vinfo.output.modes.d.size = qVar4;
    uVar19 = *(undefined4 *)&pOVar32[-1].vinfo.output.field_0x6c;
    p_Var11 = pOVar32[-1].vinfo.output.dpms_prop;
    p_Var12 = pOVar32[-1].vinfo.output.edid_blob;
    bVar22 = pOVar32[-1].vinfo.output.wants_forced_plane;
    uVar24 = *(undefined3 *)&pOVar32[-1].vinfo.output.field_0x81;
    uVar17 = pOVar32[-1].vinfo.output.forced_plane_id;
    uVar25 = *(undefined3 *)&pOVar32[-1].vinfo.output.field_0x81;
    uVar18 = pOVar32[-1].vinfo.output.forced_plane_id;
    bVar26 = pOVar32[-1].vinfo.output.forced_plane_set;
    uVar27 = *(undefined3 *)&pOVar32[-1].vinfo.output.field_0x89;
    uVar28 = pOVar32[-1].vinfo.output.drm_format;
    bVar29 = pOVar32[-1].vinfo.output.drm_format_requested_by_user;
    local_58.intermediate.current[-1].vinfo.output.subpixel = pOVar32[-1].vinfo.output.subpixel;
    *(undefined4 *)&local_58.intermediate.current[-1].vinfo.output.field_0x6c = uVar19;
    local_58.intermediate.current[-1].vinfo.output.dpms_prop = p_Var11;
    local_58.intermediate.current[-1].vinfo.output.edid_blob = p_Var12;
    local_58.intermediate.current[-1].vinfo.output.wants_forced_plane = bVar22;
    *(undefined3 *)&local_58.intermediate.current[-1].vinfo.output.field_0x81 = uVar24;
    local_58.intermediate.current[-1].vinfo.output.forced_plane_id = uVar17;
    *(undefined3 *)&local_58.intermediate.current[-1].vinfo.output.field_0x81 = uVar25;
    local_58.intermediate.current[-1].vinfo.output.forced_plane_id = uVar18;
    local_58.intermediate.current[-1].vinfo.output.forced_plane_set = bVar26;
    *(undefined3 *)&local_58.intermediate.current[-1].vinfo.output.field_0x89 = uVar27;
    local_58.intermediate.current[-1].vinfo.output.drm_format = uVar28;
    local_58.intermediate.current[-1].vinfo.output.drm_format_requested_by_user = bVar29;
    pDVar2 = pOVar32[-1].vinfo.output.clone_source.d.d;
    pOVar32[-1].vinfo.output.clone_source.d.d = (Data *)0x0;
    local_58.intermediate.current[-1].vinfo.output.clone_source.d.d = pDVar2;
    pcVar3 = pOVar32[-1].vinfo.output.clone_source.d.ptr;
    pOVar32[-1].vinfo.output.clone_source.d.ptr = (char16_t *)0x0;
    local_58.intermediate.current[-1].vinfo.output.clone_source.d.ptr = pcVar3;
    qVar4 = pOVar32[-1].vinfo.output.clone_source.d.size;
    pOVar32[-1].vinfo.output.clone_source.d.size = 0;
    local_58.intermediate.current[-1].vinfo.output.clone_source.d.size = qVar4;
    pDVar7 = pOVar32[-1].vinfo.output.available_planes.d.d;
    pOVar32[-1].vinfo.output.available_planes.d.d = (Data *)0x0;
    local_58.intermediate.current[-1].vinfo.output.available_planes.d.d = pDVar7;
    pQVar8 = pOVar32[-1].vinfo.output.available_planes.d.ptr;
    pOVar32[-1].vinfo.output.available_planes.d.ptr = (QKmsPlane *)0x0;
    local_58.intermediate.current[-1].vinfo.output.available_planes.d.ptr = pQVar8;
    qVar4 = pOVar32[-1].vinfo.output.available_planes.d.size;
    pOVar32[-1].vinfo.output.available_planes.d.size = 0;
    local_58.intermediate.current[-1].vinfo.output.available_planes.d.size = qVar4;
    QVar13 = pOVar32[-1].vinfo.output.size;
    uVar17 = pOVar32[-1].vinfo.output.crtcIdPropertyId;
    uVar18 = pOVar32[-1].vinfo.output.modeIdPropertyId;
    uVar28 = pOVar32[-1].vinfo.output.activePropertyId;
    uVar30 = pOVar32[-1].vinfo.output.mode_blob_id;
    local_58.intermediate.current[-1].vinfo.output.eglfs_plane =
         pOVar32[-1].vinfo.output.eglfs_plane;
    local_58.intermediate.current[-1].vinfo.output.size = QVar13;
    local_58.intermediate.current[-1].vinfo.output.crtcIdPropertyId = uVar17;
    local_58.intermediate.current[-1].vinfo.output.modeIdPropertyId = uVar18;
    local_58.intermediate.current[-1].vinfo.output.activePropertyId = uVar28;
    local_58.intermediate.current[-1].vinfo.output.mode_blob_id = uVar30;
    (d_first.current)->screen = (d_first.current)->screen + -0x100;
    pOVar32 = (OrderedScreen *)((first.current)->screen + -0x100);
    (first.current)->screen = (QPlatformScreen *)pOVar32;
    local_58.intermediate.current = (OrderedScreen *)(d_first.current)->screen;
  }
  while (pOVar15 != pOVar33) {
    pOVar15[-1].screen = pOVar32[-1].screen;
    RVar16.m_i = pOVar32[-1].vinfo.virtualPos.xp.m_i;
    uVar1 = *(undefined8 *)((long)&pOVar32[-1].vinfo.virtualPos.xp.m_i + 1);
    pOVar15[-1].vinfo.virtualIndex = pOVar32[-1].vinfo.virtualIndex;
    pOVar15[-1].vinfo.virtualPos.xp = (Representation)RVar16.m_i;
    *(undefined8 *)((long)&pOVar15[-1].vinfo.virtualPos.xp.m_i + 1) = uVar1;
    pDVar2 = pOVar15[-1].vinfo.output.name.d.d;
    pOVar15[-1].vinfo.output.name.d.d = pOVar32[-1].vinfo.output.name.d.d;
    pOVar32[-1].vinfo.output.name.d.d = pDVar2;
    pcVar3 = pOVar15[-1].vinfo.output.name.d.ptr;
    pOVar15[-1].vinfo.output.name.d.ptr = pOVar32[-1].vinfo.output.name.d.ptr;
    pOVar32[-1].vinfo.output.name.d.ptr = pcVar3;
    qVar4 = pOVar15[-1].vinfo.output.name.d.size;
    pOVar15[-1].vinfo.output.name.d.size = pOVar32[-1].vinfo.output.name.d.size;
    pOVar32[-1].vinfo.output.name.d.size = qVar4;
    pOVar15[-1].vinfo.output.saved_crtc = pOVar32[-1].vinfo.output.saved_crtc;
    uVar17 = pOVar32[-1].vinfo.output.connector_id;
    uVar18 = pOVar32[-1].vinfo.output.crtc_index;
    uVar28 = pOVar32[-1].vinfo.output.crtc_id;
    uVar19 = *(undefined4 *)&pOVar32[-1].vinfo.output.field_0x24;
    qVar9 = pOVar32[-1].vinfo.output.physical_size.wd;
    qVar10 = pOVar32[-1].vinfo.output.physical_size.ht;
    iVar20 = pOVar32[-1].vinfo.output.mode;
    bVar22 = pOVar32[-1].vinfo.output.mode_set;
    uVar23 = *(undefined7 *)&pOVar32[-1].vinfo.output.field_0x41;
    pOVar15[-1].vinfo.output.preferred_mode = pOVar32[-1].vinfo.output.preferred_mode;
    pOVar15[-1].vinfo.output.mode = iVar20;
    pOVar15[-1].vinfo.output.mode_set = bVar22;
    *(undefined7 *)&pOVar15[-1].vinfo.output.field_0x41 = uVar23;
    pOVar15[-1].vinfo.output.physical_size.wd = qVar9;
    pOVar15[-1].vinfo.output.physical_size.ht = qVar10;
    pOVar15[-1].vinfo.output.connector_id = uVar17;
    pOVar15[-1].vinfo.output.crtc_index = uVar18;
    pOVar15[-1].vinfo.output.crtc_id = uVar28;
    *(undefined4 *)&pOVar15[-1].vinfo.output.field_0x24 = uVar19;
    QArrayDataPointer<_drmModeModeInfo>::operator=
              (&pOVar15[-1].vinfo.output.modes.d,&pOVar32[-1].vinfo.output.modes.d);
    uVar19 = *(undefined4 *)&pOVar32[-1].vinfo.output.field_0x6c;
    p_Var11 = pOVar32[-1].vinfo.output.dpms_prop;
    p_Var12 = pOVar32[-1].vinfo.output.edid_blob;
    bVar22 = pOVar32[-1].vinfo.output.wants_forced_plane;
    uVar24 = *(undefined3 *)&pOVar32[-1].vinfo.output.field_0x81;
    uVar17 = pOVar32[-1].vinfo.output.forced_plane_id;
    uVar25 = *(undefined3 *)&pOVar32[-1].vinfo.output.field_0x81;
    uVar18 = pOVar32[-1].vinfo.output.forced_plane_id;
    bVar26 = pOVar32[-1].vinfo.output.forced_plane_set;
    uVar27 = *(undefined3 *)&pOVar32[-1].vinfo.output.field_0x89;
    uVar28 = pOVar32[-1].vinfo.output.drm_format;
    bVar29 = pOVar32[-1].vinfo.output.drm_format_requested_by_user;
    pOVar15[-1].vinfo.output.subpixel = pOVar32[-1].vinfo.output.subpixel;
    *(undefined4 *)&pOVar15[-1].vinfo.output.field_0x6c = uVar19;
    pOVar15[-1].vinfo.output.dpms_prop = p_Var11;
    pOVar15[-1].vinfo.output.edid_blob = p_Var12;
    pOVar15[-1].vinfo.output.wants_forced_plane = bVar22;
    *(undefined3 *)&pOVar15[-1].vinfo.output.field_0x81 = uVar24;
    pOVar15[-1].vinfo.output.forced_plane_id = uVar17;
    *(undefined3 *)&pOVar15[-1].vinfo.output.field_0x81 = uVar25;
    pOVar15[-1].vinfo.output.forced_plane_id = uVar18;
    pOVar15[-1].vinfo.output.forced_plane_set = bVar26;
    *(undefined3 *)&pOVar15[-1].vinfo.output.field_0x89 = uVar27;
    pOVar15[-1].vinfo.output.drm_format = uVar28;
    pOVar15[-1].vinfo.output.drm_format_requested_by_user = bVar29;
    pDVar2 = pOVar15[-1].vinfo.output.clone_source.d.d;
    pOVar15[-1].vinfo.output.clone_source.d.d = pOVar32[-1].vinfo.output.clone_source.d.d;
    pOVar32[-1].vinfo.output.clone_source.d.d = pDVar2;
    pcVar3 = pOVar15[-1].vinfo.output.clone_source.d.ptr;
    pOVar15[-1].vinfo.output.clone_source.d.ptr = pOVar32[-1].vinfo.output.clone_source.d.ptr;
    pOVar32[-1].vinfo.output.clone_source.d.ptr = pcVar3;
    qVar4 = pOVar15[-1].vinfo.output.clone_source.d.size;
    pOVar15[-1].vinfo.output.clone_source.d.size = pOVar32[-1].vinfo.output.clone_source.d.size;
    pOVar32[-1].vinfo.output.clone_source.d.size = qVar4;
    QArrayDataPointer<QKmsPlane>::operator=
              (&pOVar15[-1].vinfo.output.available_planes.d,
               &pOVar32[-1].vinfo.output.available_planes.d);
    QVar13 = pOVar32[-1].vinfo.output.size;
    uVar17 = pOVar32[-1].vinfo.output.crtcIdPropertyId;
    uVar18 = pOVar32[-1].vinfo.output.modeIdPropertyId;
    uVar28 = pOVar32[-1].vinfo.output.activePropertyId;
    uVar30 = pOVar32[-1].vinfo.output.mode_blob_id;
    pOVar15[-1].vinfo.output.eglfs_plane = pOVar32[-1].vinfo.output.eglfs_plane;
    pOVar15[-1].vinfo.output.size = QVar13;
    pOVar15[-1].vinfo.output.crtcIdPropertyId = uVar17;
    pOVar15[-1].vinfo.output.modeIdPropertyId = uVar18;
    pOVar15[-1].vinfo.output.activePropertyId = uVar28;
    pOVar15[-1].vinfo.output.mode_blob_id = uVar30;
    (d_first.current)->screen = (d_first.current)->screen + -0x100;
    pOVar32 = (OrderedScreen *)((first.current)->screen + -0x100);
    (first.current)->screen = (QPlatformScreen *)pOVar32;
    pOVar15 = (OrderedScreen *)(d_first.current)->screen;
  }
  local_58.iter = &local_58.end;
  while (pOVar32 != pOVar31) {
    (first.current)->screen = (QPlatformScreen *)(pOVar32 + 1);
    QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&(pOVar32->vinfo).output.available_planes.d);
    pDVar2 = (pOVar32->vinfo).output.clone_source.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pOVar32->vinfo).output.clone_source.d.d)->super_QArrayData,2,0x10)
        ;
      }
    }
    pDVar5 = (pOVar32->vinfo).output.modes.d.d;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pOVar32->vinfo).output.modes.d.d)->super_QArrayData,0x44,0x10);
      }
    }
    pDVar2 = (pOVar32->vinfo).output.name.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pOVar32->vinfo).output.name.d.d)->super_QArrayData,2,0x10);
      }
    }
    pOVar32 = (OrderedScreen *)(first.current)->screen;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<OrderedScreen_*>,_long_long>::Destructor::
  ~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}